

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

int __thiscall Assimp::CFIReaderImpl::getAttributeValueAsInt(CFIReaderImpl *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<const_Assimp::FIIntValue> intValue;
  shared_ptr<const_Assimp::FIValue> local_28;
  
  iVar1 = 0;
  if ((-1 < idx) &&
     (iVar1 = 0,
     idx < (int)(((long)(this->attributes).
                        super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->attributes).
                       super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x90))) {
    std::dynamic_pointer_cast<Assimp::FIIntValue_const,Assimp::FIValue_const>(&local_28);
    if (local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar1 = (**((this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start[(uint)idx].value.
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      iVar1 = atoi(*(char **)CONCAT44(extraout_var,iVar1));
    }
    else {
      iVar1 = 0;
      if ((long)local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[2]._vptr_FIValue -
          (long)local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[1]._vptr_FIValue == 4) {
        iVar1 = *(int *)local_28.
                        super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [1]._vptr_FIValue;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return iVar1;
}

Assistant:

virtual int getAttributeValueAsInt(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return 0;
        }
        std::shared_ptr<const FIIntValue> intValue = std::dynamic_pointer_cast<const FIIntValue>(attributes[idx].value);
        if (intValue) {
            return intValue->value.size() == 1 ? intValue->value.front() : 0;
        }
        return atoi(attributes[idx].value->toString().c_str());
    }